

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGRectElement::updateShape(SVGRectElement *this,Path *path)

{
  Rect RVar1;
  float *pfVar2;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float ry;
  float rx;
  float y;
  float x;
  float height;
  float width;
  LengthContext lengthContext;
  Path *path_local;
  SVGRectElement *this_local;
  undefined8 local_10;
  
  lengthContext._8_8_ = path;
  LengthContext::LengthContext((LengthContext *)&height,(SVGElement *)this,UserSpaceOnUse);
  x = LengthContext::valueForLength((LengthContext *)&height,&this->m_width);
  y = LengthContext::valueForLength((LengthContext *)&height,&this->m_height);
  if ((x <= 0.0) || (y <= 0.0)) {
    this_local = (SVGRectElement *)0x0;
    local_10._0_4_ = 0.0;
    local_10._4_4_ = 0.0;
  }
  else {
    rx = LengthContext::valueForLength((LengthContext *)&height,&this->m_x);
    ry = LengthContext::valueForLength((LengthContext *)&height,&this->m_y);
    local_4c = LengthContext::valueForLength((LengthContext *)&height,&this->m_rx);
    local_50 = LengthContext::valueForLength((LengthContext *)&height,&this->m_ry);
    if (local_4c <= 0.0) {
      local_4c = local_50;
    }
    if (local_50 <= 0.0) {
      local_50 = local_4c;
    }
    local_54 = x / 2.0;
    pfVar2 = std::min<float>(&local_4c,&local_54);
    local_4c = *pfVar2;
    local_58 = y / 2.0;
    pfVar2 = std::min<float>(&local_50,&local_58);
    local_50 = *pfVar2;
    Path::addRoundRect((Path *)lengthContext._8_8_,rx,ry,x,y,local_4c,local_50);
    Rect::Rect((Rect *)&this_local,rx,ry,x,y);
  }
  RVar1.w = (float)local_10;
  RVar1.h = local_10._4_4_;
  RVar1._0_8_ = this_local;
  return RVar1;
}

Assistant:

Rect SVGRectElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto width = lengthContext.valueForLength(m_width);
    auto height = lengthContext.valueForLength(m_height);
    if(width <= 0.f || height <= 0.f) {
        return Rect::Empty;
    }

    auto x = lengthContext.valueForLength(m_x);
    auto y = lengthContext.valueForLength(m_y);

    auto rx = lengthContext.valueForLength(m_rx);
    auto ry = lengthContext.valueForLength(m_ry);

    if(rx <= 0.f) rx = ry;
    if(ry <= 0.f) ry = rx;

    rx = std::min(rx, width / 2.f);
    ry = std::min(ry, height / 2.f);

    path.addRoundRect(x, y, width, height, rx, ry);
    return Rect(x, y, width, height);
}